

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O3

string * __thiscall
vkt::SpirVAssembly::(anonymous_namespace)::makeLongUTF8String_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,size_t num4ByteChars)

{
  string *psVar1;
  string *extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> earthAfrica;
  long *local_40 [2];
  long local_30 [2];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,anon_var_dwarf_97e9c9,anon_var_dwarf_97e9c9 + 4);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar1 = (string *)std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (this != (_anonymous_namespace_ *)0x0) {
    do {
      psVar1 = (string *)
               std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40[0]);
      this = this + -1;
    } while (this != (_anonymous_namespace_ *)0x0);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
    psVar1 = extraout_RAX;
  }
  return psVar1;
}

Assistant:

inline std::string makeLongUTF8String (size_t num4ByteChars)
{
	// An example of a longest valid UTF-8 character.  Be explicit about the
	// character type because Microsoft compilers can otherwise interpret the
	// character string as being over wide (16-bit) characters. Ideally, we
	// would just use a C++11 UTF-8 string literal, but we want to support older
	// Microsoft compilers.
	const std::basic_string<char> earthAfrica("\xF0\x9F\x8C\x8D");
	std::string longString;
	longString.reserve(num4ByteChars * 4);
	for (size_t count = 0; count < num4ByteChars; count++)
	{
		longString += earthAfrica;
	}
	return longString;
}